

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void setupTestEnvironment(Setup *s,long round)

{
  int iVar1;
  uint uVar2;
  u32 uVar3;
  ushort local_28;
  uint local_24;
  int local_20;
  uint i_2;
  int i_1;
  int i;
  long round_local;
  Setup *s_local;
  
  s->round = round;
  s->supervisor = round % 2 != 0;
  iVar1 = rand();
  s->ccr = (u8)iVar1;
  iVar1 = Randomizer::rand((Randomizer *)&randomizer);
  s->ext1 = (u16)iVar1;
  iVar1 = Randomizer::rand((Randomizer *)&randomizer);
  s->ext2 = (u16)iVar1;
  iVar1 = Randomizer::rand((Randomizer *)&randomizer);
  s->ext3 = (u16)iVar1;
  if (cpuModel == M68000) {
    local_28 = 0;
  }
  else {
    iVar1 = Randomizer::rand((Randomizer *)&randomizer);
    local_28 = (ushort)iVar1 & 0xfffe;
  }
  s->vbr = local_28;
  iVar1 = Randomizer::rand((Randomizer *)&randomizer);
  s->sfc = (u16)iVar1;
  iVar1 = Randomizer::rand((Randomizer *)&randomizer);
  s->dfc = (u16)iVar1;
  uVar2 = Randomizer::rand((Randomizer *)&randomizer);
  uVar3 = moira::Moira::cacrMask(&moiracpu->super_Moira);
  s->cacr = uVar2 & uVar3;
  uVar3 = Randomizer::rand((Randomizer *)&randomizer);
  s->caar = uVar3;
  for (i_2 = 0; (int)i_2 < 8; i_2 = i_2 + 1) {
    uVar3 = Randomizer::rand((Randomizer *)&randomizer);
    s->d[(int)i_2] = uVar3;
  }
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    uVar3 = Randomizer::rand((Randomizer *)&randomizer);
    s->a[local_20] = uVar3;
  }
  for (local_24 = 0; local_24 < 0x10000; local_24 = local_24 + 1) {
    iVar1 = Randomizer::rand((Randomizer *)&randomizer);
    s->mem[local_24] = (u8)iVar1;
  }
  return;
}

Assistant:

void setupTestEnvironment(Setup &s, long round)
{
    s.round = round;
    s.supervisor = round % 2;
    s.ccr = u8(rand());
    s.ext1 = u16(randomizer.rand());
    s.ext2 = u16(randomizer.rand());
    s.ext3 = u16(randomizer.rand());
    s.vbr = cpuModel == Model::M68000 ? 0 : u16(randomizer.rand() & ~1);
    s.sfc = u16(randomizer.rand());
    s.dfc = u16(randomizer.rand());
    s.cacr = randomizer.rand() & moiracpu->cacrMask();
    s.caar = randomizer.rand();

    for (int i = 0; i < 8; i++) s.d[i] = randomizer.rand();
    for (int i = 0; i < 8; i++) s.a[i] = randomizer.rand();

    for (unsigned i = 0; i < sizeof(s.mem); i++) {
        s.mem[i] = u8(randomizer.rand());
    }
}